

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

value_type __thiscall djb::utia::eval(utia *this,vec3 *wi,vec3 *wo,void *param_3)

{
  pointer pdVar1;
  long lVar2;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *pfVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int isp;
  long lVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  value_type vVar16;
  int itv [2];
  int iti [2];
  float_t RGB [3];
  int ipv [2];
  int ipi [2];
  int local_a4 [4];
  float local_94 [3];
  int local_88 [4];
  double local_78;
  undefined8 uStack_70;
  float local_68 [14];
  
  fVar10 = acosf(wo->z);
  fVar10 = fVar10 * 57.295776;
  local_78._0_4_ = acosf(*(float *)((long)param_3 + 8));
  fVar11 = atan2f(wo->y,wo->x);
  fVar12 = atan2f(*(float *)((long)param_3 + 4),*param_3);
  if ((90.0 <= fVar10) || (90.0 <= local_78._0_4_ * 57.295776)) {
    (**(code **)(*(long *)wi + 0x10))(this,wi);
    pfVar3 = extraout_RDX_00;
  }
  else {
    local_78 = (double)CONCAT44(local_78._4_4_,local_78._0_4_ * 57.295776);
    fVar12 = fVar12 * 57.295776;
    for (fVar11 = fVar11 * 57.295776; fVar11 < 0.0; fVar11 = fVar11 + 360.0) {
    }
    for (; fVar12 < 0.0; fVar12 = fVar12 + 360.0) {
    }
    for (; 360.0 <= fVar11; fVar11 = fVar11 + -360.0) {
    }
    for (; 360.0 <= fVar12; fVar12 = fVar12 + -360.0) {
    }
    fVar13 = floorf(fVar10 / 15.0);
    local_a4[2] = (int)fVar13;
    local_a4[3] = local_a4[2] + 1;
    if (4 < local_a4[2]) {
      local_a4[2] = 4;
      local_a4[3] = 5;
    }
    fVar13 = floorf(local_78._0_4_ / 15.0);
    local_a4[0] = (int)fVar13;
    local_a4[1] = local_a4[0] + 1;
    if (4 < local_a4[0]) {
      local_a4[0] = 4;
      local_a4[1] = 5;
    }
    local_68[8] = floorf(fVar11 / 7.5);
    local_88[2] = (int)local_68[8];
    iVar4 = local_88[2] + 1;
    local_88[3] = iVar4;
    fVar13 = floorf(fVar12 / 7.5);
    local_88[0] = (int)fVar13;
    local_88[1] = (int)fVar13 + 1;
    fVar14 = (float)local_a4[2] * -15.0 + fVar10;
    fVar10 = (float)local_a4[3] * 15.0 - fVar10;
    fVar15 = fVar14 + fVar10;
    local_68[6] = fVar10 / fVar15;
    local_68[7] = fVar14 / fVar15;
    fVar15 = (float)local_a4[0] * -15.0 + local_78._0_4_;
    fVar10 = (float)local_a4[1] * 15.0 - local_78._0_4_;
    fVar14 = fVar15 + fVar10;
    local_68[4] = fVar10 / fVar14;
    local_68[5] = fVar15 / fVar14;
    fVar10 = (float)(int)local_68[8] * -7.5 + fVar11;
    fVar11 = (float)iVar4 * 7.5 - fVar11;
    fVar14 = fVar10 + fVar11;
    local_68[2] = fVar11 / fVar14;
    local_68[3] = fVar10 / fVar14;
    fVar11 = (float)(int)fVar13 * -7.5 + fVar12;
    fVar12 = (float)local_88[1] * 7.5 - fVar12;
    fVar10 = fVar11 + fVar12;
    local_68[0] = fVar12 / fVar10;
    lVar8 = 0;
    if (iVar4 == 0x30) {
      iVar4 = 0;
    }
    local_68[1] = fVar11 / fVar10;
    if (local_88[1] == 0x30) {
      local_88[1] = 0;
    }
    local_88[3] = iVar4;
    do {
      local_94[lVar8] = 0.0;
      fVar11 = 0.0;
      lVar2 = 0;
      do {
        lVar5 = 0;
        do {
          lVar6 = 0;
          do {
            lVar7 = 0;
            do {
              fVar11 = fVar11 + (float)*(double *)
                                        (*(long *)&wi->z +
                                        ((long)local_88[lVar7] +
                                        (long)((local_88[lVar6 + 2] + local_a4[lVar2 + 2] * 0x30) *
                                               0x120 + (int)lVar8 * 0x14400) +
                                        (long)local_a4[lVar5] * 0x30) * 8) *
                                local_68[lVar7] *
                                local_68[lVar6 + 2] * local_68[lVar5 + 4] * local_68[lVar2 + 6];
              lVar7 = lVar7 + 1;
            } while (lVar7 == 1);
            bVar9 = lVar6 == 0;
            lVar6 = lVar6 + 1;
          } while (bVar9);
          bVar9 = lVar5 == 0;
          lVar5 = lVar5 + 1;
        } while (bVar9);
        bVar9 = lVar2 == 0;
        lVar2 = lVar2 + 1;
      } while (bVar9);
      local_94[lVar8] = fVar11;
      if (fVar11 <= 0.0375) {
        fVar11 = fVar11 / 12.92;
      }
      else {
        fVar11 = powf((fVar11 + 0.055) / 1.055,2.4);
      }
      local_94[lVar8] = fVar11 * 100.0;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    fVar11 = 0.0;
    if (0.0 <= local_94[0]) {
      fVar11 = local_94[0];
    }
    fVar12 = *(float *)((long)param_3 + 8);
    fVar10 = 0.0;
    if (0.0 <= local_94[1]) {
      fVar10 = local_94[1];
    }
    fVar13 = 0.0;
    if (0.0 <= local_94[2]) {
      fVar13 = local_94[2];
    }
    local_78 = (double)CONCAT44(fVar10 * fVar12,fVar11 * fVar12);
    uStack_70 = 0;
    (this->super_brdf_rgb).super_brdf._vptr_brdf = (_func_int **)0x3;
    pdVar1 = (pointer)operator_new(0xc);
    (this->m_samples).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = pdVar1;
    *pdVar1 = local_78;
    *(float *)(pdVar1 + 1) = fVar13 * fVar12;
    pfVar3 = extraout_RDX;
  }
  vVar16._M_data = pfVar3;
  vVar16._M_size = (size_t)this;
  return vVar16;
}

Assistant:

brdf::value_type
utia::eval(const vec3 &wi, const vec3 &wo, const void *) const
{
	float_t r2d = 180 / m_pi();
	float_t theta_i = r2d * acos(wi.z);
	float_t theta_o = r2d * acos(wo.z);
	float_t phi_i = r2d * atan2(wi.y, wi.x);
	float_t phi_o = r2d * atan2(wo.y, wo.x);

	// make sure we're above horizon
	if (theta_i >= 90 || theta_o >= 90)
		return zero_value();

	// make sure phi is in [0, 360)
	while (phi_i < 0) {phi_i+= 360;}
	while (phi_o < 0) {phi_o+= 360;}
	while (phi_i >= 360) {phi_i-= 360;}
	while (phi_o >= 360) {phi_o-= 360;}

	int iti[2], itv[2], ipi[2], ipv[2];
	iti[0] = (int)floor(theta_i / DJB__UTIA_STEP_T);
	iti[1] = iti[0] + 1;
	if(iti[0] > DJB__UTIA_NTI - 2) {
		iti[0] = DJB__UTIA_NTI - 2;
		iti[1] = DJB__UTIA_NTI - 1;
	}
	itv[0] = (int)floor(theta_o / DJB__UTIA_STEP_T);
	itv[1] = itv[0] + 1;
	if(itv[0] > DJB__UTIA_NTV - 2) {
		itv[0] = DJB__UTIA_NTV - 2;
		itv[1] = DJB__UTIA_NTV - 1;
	}

	ipi[0] = (int)floor(phi_i / DJB__UTIA_STEP_P);
	ipi[1] = ipi[0] + 1;
	ipv[0] = (int)floor(phi_o / DJB__UTIA_STEP_P);
	ipv[1] = ipv[0] + 1;

	float_t sum;
	float_t wti[2], wtv[2], wpi[2], wpv[2];
	wti[1] = theta_i - (float_t)(DJB__UTIA_STEP_T * iti[0]);
	wti[0] = (float_t)(DJB__UTIA_STEP_T * iti[1]) - theta_i;
	sum = wti[0] + wti[1];
	wti[0]/= sum;
	wti[1]/= sum;
	wtv[1] = theta_o - (float_t)(DJB__UTIA_STEP_T * itv[0]);
	wtv[0] = (float_t)(DJB__UTIA_STEP_T * itv[1]) - theta_o;
	sum = wtv[0] + wtv[1];
	wtv[0]/= sum;
	wtv[1]/= sum;

	wpi[1] = phi_i - (float_t)(DJB__UTIA_STEP_P * ipi[0]);
	wpi[0] = (float_t)(DJB__UTIA_STEP_P * ipi[1]) - phi_i;
	sum = wpi[0] + wpi[1];
	wpi[0]/= sum;
	wpi[1]/= sum;
	wpv[1] = phi_o - (float_t)(DJB__UTIA_STEP_P * ipv[0]);
	wpv[0] = (float_t)(DJB__UTIA_STEP_P * ipv[1]) - phi_o;
	sum = wpv[0] + wpv[1];
	wpv[0]/= sum;
	wpv[1]/= sum;

	if(ipi[1] == DJB__UTIA_NPI)
		ipi[1] = 0;
	if(ipv[1] == DJB__UTIA_NPV)
		ipv[1] = 0;

	int nc = DJB__UTIA_NPV * DJB__UTIA_NTV;
	int nr = DJB__UTIA_NPI * DJB__UTIA_NTI;
	float_t RGB[DJB__UTIA_PLANES];
	for(int isp = 0; isp < DJB__UTIA_PLANES; ++isp) {
		int i, j, k, l;

		RGB[isp] = 0;
		for(i = 0; i < 2; ++i)
		for(j = 0; j < 2; ++j)
		for(k = 0; k < 2; ++k)
		for(l = 0; l < 2; ++l) {
			float_t w = wti[i] * wtv[j] * wpi[k] * wpv[l];
			int idx = isp * nr * nc + nc * (DJB__UTIA_NPI * iti[i] + ipi[k]) 
			        + DJB__UTIA_NPV * itv[j] + ipv[l];

			RGB[isp]+= w * (float_t)m_samples[idx];
		}
		if (RGB[isp] > (float_t)0.0375)
			RGB[isp] = pow((RGB[isp] + (float_t)0.055)/(float_t)1.055, (float_t)2.4);
		else
			RGB[isp]/= (float_t)12.92;
		RGB[isp]*= 100;
	}

	vec3 rgb = wo.z * vec3(
		max((float_t)0, RGB[0]),
		max((float_t)0, RGB[1]),
		max((float_t)0, RGB[2])
	);

	return brdf::value_type(&rgb[0], 3);
}